

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int CVodeSetJacFn(void *cvode_mem,CVLsJacFn jac)

{
  int iVar1;
  CVodeMem pCVar2;
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetJacFn",&cv_mem,&cvls_mem);
  if (iVar1 == 0) {
    if (jac == (CVLsJacFn)0x0) {
      cvls_mem->jacDQ = 1;
      cvls_mem->jac = cvLsDQJac;
      pCVar2 = cv_mem;
    }
    else {
      if (cvls_mem->A == (SUNMatrix)0x0) {
        cvProcessError(cv_mem,-3,0x174,"CVodeSetJacFn",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                       ,"Jacobian routine cannot be supplied for NULL SUNMatrix");
        return -3;
      }
      cvls_mem->jacDQ = 0;
      cvls_mem->jac = jac;
      pCVar2 = (CVodeMem)cv_mem->cv_user_data;
    }
    cvls_mem->J_data = pCVar2;
    cvls_mem->user_linsys = 0;
    cvls_mem->linsys = cvLsLinSys;
    cvls_mem->A_data = cv_mem;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetJacFn(void* cvode_mem, CVLsJacFn jac)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* return with failure if jac cannot be used */
  if ((jac != NULL) && (cvls_mem->A == NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Jacobian routine cannot be supplied for NULL SUNMatrix");
    return (CVLS_ILL_INPUT);
  }

  /* set the Jacobian routine pointer, and update relevant flags */
  if (jac != NULL)
  {
    cvls_mem->jacDQ  = SUNFALSE;
    cvls_mem->jac    = jac;
    cvls_mem->J_data = cv_mem->cv_user_data;
  }
  else
  {
    cvls_mem->jacDQ  = SUNTRUE;
    cvls_mem->jac    = cvLsDQJac;
    cvls_mem->J_data = cv_mem;
  }

  /* ensure the internal linear system function is used */
  cvls_mem->user_linsys = SUNFALSE;
  cvls_mem->linsys      = cvLsLinSys;
  cvls_mem->A_data      = cv_mem;

  return (CVLS_SUCCESS);
}